

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>(date_t input)

{
  bool bVar1;
  date_t in_EDI;
  date_t in_stack_00000030;
  undefined4 local_4;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDI);
  if (bVar1) {
    local_4 = CenturyOperator::Operation<duckdb::date_t,duckdb::date_t>(in_EDI);
  }
  else {
    local_4 = Cast::Operation<duckdb::date_t,duckdb::date_t>(in_stack_00000030);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}